

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini-gmp.c
# Opt level: O0

mp_limb_t mpn_invert_3by2(mp_limb_t u1,mp_limb_t u0)

{
  mp_limb_t mVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  mp_limb_t __v;
  mp_limb_t __u;
  uint __vh;
  uint __uh;
  uint __vl;
  uint __ul;
  mp_limb_t __x3;
  mp_limb_t __x2;
  mp_limb_t __x1;
  mp_limb_t __x0;
  mp_limb_t tl;
  mp_limb_t th;
  uint qh;
  uint uh;
  uint ul;
  mp_limb_t ql;
  mp_limb_t m;
  mp_limb_t p;
  mp_limb_t r;
  mp_limb_t u0_local;
  mp_limb_t u1_local;
  
  if (u1 < 0x8000000000000000) {
    __assert_fail("u1 >= GMP_LIMB_HIGHBIT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/vbirds[P]Bignumber/mini-gmp.c"
                  ,0x2e5,"mp_limb_t mpn_invert_3by2(mp_limb_t, mp_limb_t)");
  }
  uVar2 = (uint)(u1 >> 0x20);
  uVar4 = (u1 ^ 0xffffffffffffffff) / (ulong)uVar2;
  uVar3 = (uint)uVar4;
  p = (u1 ^ 0xffffffffffffffff) - (uVar4 & 0xffffffff) * (ulong)uVar2 << 0x20 | 0xffffffff;
  uVar4 = (uVar4 & 0xffffffff) * (u1 & 0xffffffff);
  th._4_4_ = uVar3;
  if (p < uVar4) {
    th._4_4_ = uVar3 - 1;
    p = u1 + p;
    if ((u1 <= p) && (p < uVar4)) {
      th._4_4_ = uVar3 - 2;
      p = u1 + p;
    }
  }
  uVar4 = p - uVar4;
  uVar5 = (uVar4 >> 0x20) * (ulong)th._4_4_ + uVar4;
  uVar6 = uVar5 >> 0x20;
  _uh = uVar6 + 1;
  p = ((uVar4 << 0x20) + 0xffffffff) - _uh * u1;
  if (uVar5 << 0x20 <= p) {
    p = u1 + p;
    _uh = uVar6;
  }
  ql = ((ulong)th._4_4_ << 0x20) + _uh;
  if (u1 <= p) {
    ql = ql + 1;
    p = p - u1;
  }
  if (u0 != 0) {
    p = u0 + (p ^ 0xffffffffffffffff);
    if (p < u0) {
      mVar1 = ql - 1;
      if (u1 <= p) {
        p = p - u1;
        mVar1 = ql - 2;
      }
      ql = mVar1;
      p = p - u1;
    }
    uVar2 = (uint)(u0 >> 0x20);
    uVar3 = (uint)(ql >> 0x20);
    uVar4 = (u0 & 0xffffffff) * (ql & 0xffffffff);
    uVar5 = (ulong)uVar2 * (ql & 0xffffffff);
    ___vl = (ulong)uVar2 * (ulong)uVar3;
    uVar6 = uVar5 + (uVar4 >> 0x20) + (u0 & 0xffffffff) * (ulong)uVar3;
    if (uVar6 < uVar5) {
      ___vl = ___vl + 0x100000000;
    }
    uVar5 = ___vl + (uVar6 >> 0x20);
    uVar7 = uVar5 + p;
    if (uVar7 < uVar5) {
      ql = (ql - 1) -
           (long)(int)(uint)(u1 < uVar7 ||
                            uVar7 == u1 && u0 < (uVar6 << 0x20) + (uVar4 & 0xffffffff));
    }
  }
  return ql;
}

Assistant:

mp_limb_t
mpn_invert_3by2 (mp_limb_t u1, mp_limb_t u0)
{
  mp_limb_t r, p, m, ql;
  unsigned ul, uh, qh;

  assert (u1 >= GMP_LIMB_HIGHBIT);

  /* For notation, let b denote the half-limb base, so that B = b^2.
     Split u1 = b uh + ul. */
  ul = u1 & GMP_LLIMB_MASK;
  uh = u1 >> (GMP_LIMB_BITS / 2);

  /* Approximation of the high half of quotient. Differs from the 2/1
     inverse of the half limb uh, since we have already subtracted
     u0. */
  qh = ~u1 / uh;

  /* Adjust to get a half-limb 3/2 inverse, i.e., we want

     qh' = floor( (b^3 - 1) / u) - b = floor ((b^3 - b u - 1) / u
         = floor( (b (~u) + b-1) / u),

     and the remainder

     r = b (~u) + b-1 - qh (b uh + ul)
       = b (~u - qh uh) + b-1 - qh ul

     Subtraction of qh ul may underflow, which implies adjustments.
     But by normalization, 2 u >= B > qh ul, so we need to adjust by
     at most 2.
  */

  r = ((~u1 - (mp_limb_t) qh * uh) << (GMP_LIMB_BITS / 2)) | GMP_LLIMB_MASK;

  p = (mp_limb_t) qh * ul;
  /* Adjustment steps taken from udiv_qrnnd_c */
  if (r < p)
    {
      qh--;
      r += u1;
      if (r >= u1) /* i.e. we didn't get carry when adding to r */
	if (r < p)
	  {
	    qh--;
	    r += u1;
	  }
    }
  r -= p;

  /* Low half of the quotient is

       ql = floor ( (b r + b-1) / u1).

     This is a 3/2 division (on half-limbs), for which qh is a
     suitable inverse. */

  p = (r >> (GMP_LIMB_BITS / 2)) * qh + r;
  /* Unlike full-limb 3/2, we can add 1 without overflow. For this to
     work, it is essential that ql is a full mp_limb_t. */
  ql = (p >> (GMP_LIMB_BITS / 2)) + 1;

  /* By the 3/2 trick, we don't need the high half limb. */
  r = (r << (GMP_LIMB_BITS / 2)) + GMP_LLIMB_MASK - ql * u1;

  if (r >= (p << (GMP_LIMB_BITS / 2)))
    {
      ql--;
      r += u1;
    }
  m = ((mp_limb_t) qh << (GMP_LIMB_BITS / 2)) + ql;
  if (r >= u1)
    {
      m++;
      r -= u1;
    }

  /* Now m is the 2/1 invers of u1. If u0 > 0, adjust it to become a
     3/2 inverse. */
  if (u0 > 0)
    {
      mp_limb_t th, tl;
      r = ~r;
      r += u0;
      if (r < u0)
	{
	  m--;
	  if (r >= u1)
	    {
	      m--;
	      r -= u1;
	    }
	  r -= u1;
	}
      gmp_umul_ppmm (th, tl, u0, m);
      r += th;
      if (r < th)
	{
	  m--;
	  m -= ((r > u1) | ((r == u1) & (tl > u0)));
	}
    }

  return m;
}